

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_window_expression.cpp
# Opt level: O0

LogicalType *
duckdb::BindRangeExpression
          (ClientContext *context,string *name,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *expr,unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *order_expr)

{
  byte bVar1;
  bool bVar2;
  string *name_00;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar3;
  pointer pEVar4;
  optional_idx error_context_00;
  undefined8 uVar5;
  ErrorData *in_RDI;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> function;
  FunctionBinder function_binder;
  ErrorData error;
  QueryErrorContext error_context;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *bound;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *bound_order;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  children;
  undefined4 in_stack_fffffffffffffd48;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffd4c;
  ErrorData *in_stack_fffffffffffffd50;
  LogicalType *in_stack_fffffffffffffd58;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  *in_stack_fffffffffffffd60;
  undefined8 in_stack_fffffffffffffd68;
  LogicalTypeId id;
  LogicalType *in_stack_fffffffffffffd70;
  allocator *paVar7;
  ParsedExpression *in_stack_fffffffffffffd90;
  string *prepended_message;
  ErrorData *in_stack_fffffffffffffda0;
  undefined7 in_stack_fffffffffffffdb0;
  LogicalType *this;
  undefined1 is_operator;
  ErrorData *children_00;
  undefined6 in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe0e;
  allocator in_stack_fffffffffffffe0f;
  FunctionBinder *in_stack_fffffffffffffe10;
  optional_ptr<duckdb::Binder,_true> in_stack_fffffffffffffe18;
  allocator local_1c1;
  string local_1c0 [32];
  optional_ptr<duckdb::Binder,_true> local_1a0 [4];
  undefined1 local_179 [191];
  undefined1 local_ba;
  allocator local_b9;
  string local_b8 [32];
  idx_t local_98;
  idx_t local_78;
  optional_idx local_70;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *local_68;
  undefined1 local_60 [24];
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *local_48;
  
  id = (LogicalTypeId)((ulong)in_stack_fffffffffffffd68 >> 0x38);
  children_00 = in_RDI;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            *)0xdaf55f);
  name_00 = (string *)
            unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
            ::operator*((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                         *)in_stack_fffffffffffffd50);
  puVar3 = BoundExpression::GetExpression(in_stack_fffffffffffffd90);
  local_48 = puVar3;
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_fffffffffffffd50);
  is_operator = (undefined1)((ulong)puVar3 >> 0x38);
  (*(pEVar4->super_BaseExpression)._vptr_BaseExpression[0x11])(local_60);
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            (in_stack_fffffffffffffd60,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             in_stack_fffffffffffffd58);
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             0xdaf5f6);
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
  operator*((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             *)in_stack_fffffffffffffd50);
  local_68 = BoundExpression::GetExpression(in_stack_fffffffffffffd90);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_fffffffffffffd50);
  local_78 = (idx_t)BaseExpression::GetQueryLocation(&pEVar4->super_BaseExpression);
  QueryErrorContext::QueryErrorContext((QueryErrorContext *)&local_70,(optional_idx)local_78);
  error_context_00.index =
       (idx_t)unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          *)in_stack_fffffffffffffd50);
  this = &((pointer)error_context_00.index)->return_type;
  LogicalType::LogicalType(in_stack_fffffffffffffd70,id);
  bVar1 = LogicalType::operator==
                    (in_stack_fffffffffffffd58,(LogicalType *)in_stack_fffffffffffffd50);
  LogicalType::~LogicalType((LogicalType *)0xdaf6d2);
  if ((bVar1 & 1) != 0) {
    local_ba = 1;
    uVar5 = __cxa_allocate_exception(0x10);
    local_98 = local_70.index;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_b8,"Window RANGE expressions cannot be NULL",&local_b9);
    BinderException::BinderException<>
              ((BinderException *)this,(QueryErrorContext)error_context_00.index,
               (string *)CONCAT17(bVar1,in_stack_fffffffffffffdb0));
    local_ba = 0;
    __cxa_throw(uVar5,&BinderException::typeinfo,BinderException::~BinderException);
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            (in_stack_fffffffffffffd60,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             in_stack_fffffffffffffd58);
  ErrorData::ErrorData(in_stack_fffffffffffffd50);
  FunctionBinder::FunctionBinder
            ((FunctionBinder *)in_stack_fffffffffffffd50,
             (ClientContext *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
  prepended_message = (string *)local_179;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)(local_179 + 1),"main",(allocator *)prepended_message);
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            *)in_stack_fffffffffffffd50,
           (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
  optional_ptr<duckdb::Binder,_true>::optional_ptr(local_1a0,(Binder *)0x0);
  uVar6 = 1;
  FunctionBinder::BindScalarFunction
            (in_stack_fffffffffffffe10,
             (string *)
             CONCAT17(in_stack_fffffffffffffe0f,
                      CONCAT16(in_stack_fffffffffffffe0e,in_stack_fffffffffffffe08)),name_00,
             (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              *)children_00,in_RDI,(bool)is_operator,in_stack_fffffffffffffe18);
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             *)0xdaf92d);
  ::std::__cxx11::string::~string((string *)(local_179 + 1));
  ::std::allocator<char>::~allocator((allocator<char> *)local_179);
  bVar2 = ::std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *)
                     0xdaf954);
  if (!bVar2) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_1c0,anon_var_dwarf_3eb64fd + 9,&local_1c1);
    ErrorData::Throw(in_stack_fffffffffffffda0,prepended_message);
  }
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             local_1a0[0].ptr);
  bVar2 = IsRangeType((LogicalType *)CONCAT44(in_stack_fffffffffffffd4c,uVar6));
  if (!bVar2) {
    uVar5 = __cxa_allocate_exception(0x10);
    paVar7 = (allocator *)&stack0xfffffffffffffe0f;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffe10,"Invalid type for Window RANGE expression",paVar7)
    ;
    BinderException::BinderException<>
              ((BinderException *)this,(QueryErrorContext)error_context_00.index,
               (string *)CONCAT17(bVar1,in_stack_fffffffffffffdb0));
    __cxa_throw(uVar5,&BinderException::typeinfo,BinderException::~BinderException);
  }
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator=
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             local_1a0[0].ptr,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             CONCAT44(in_stack_fffffffffffffd4c,uVar6));
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             local_1a0[0].ptr);
  LogicalType::LogicalType
            ((LogicalType *)local_1a0[0].ptr,
             (LogicalType *)CONCAT44(in_stack_fffffffffffffd4c,uVar6));
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             0xdafbe6);
  ErrorData::~ErrorData((ErrorData *)local_1a0[0].ptr);
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             *)0xdafc00);
  return (LogicalType *)children_00;
}

Assistant:

static LogicalType BindRangeExpression(ClientContext &context, const string &name, unique_ptr<ParsedExpression> &expr,
                                       unique_ptr<ParsedExpression> &order_expr) {

	vector<unique_ptr<Expression>> children;

	D_ASSERT(order_expr.get());
	D_ASSERT(order_expr->GetExpressionClass() == ExpressionClass::BOUND_EXPRESSION);
	auto &bound_order = BoundExpression::GetExpression(*order_expr);
	children.emplace_back(bound_order->Copy());

	D_ASSERT(expr.get());
	D_ASSERT(expr->GetExpressionClass() == ExpressionClass::BOUND_EXPRESSION);
	auto &bound = BoundExpression::GetExpression(*expr);
	QueryErrorContext error_context(bound->GetQueryLocation());
	if (bound->return_type == LogicalType::SQLNULL) {
		throw BinderException(error_context, "Window RANGE expressions cannot be NULL");
	}
	children.emplace_back(std::move(bound));

	ErrorData error;
	FunctionBinder function_binder(context);
	auto function = function_binder.BindScalarFunction(DEFAULT_SCHEMA, name, std::move(children), error, true);
	if (!function) {
		error.Throw();
	}
	// +/- can be applied to non-scalar types,
	// so we can't rely on function binding to catch all problems.
	if (!IsRangeType(function->return_type)) {
		throw BinderException(error_context, "Invalid type for Window RANGE expression");
	}
	bound = std::move(function);
	return bound->return_type;
}